

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test::
~TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test
          (TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}